

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_idict_getkey(stb_idict *a,stb_int32 k,stb_int32 *kout)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = stb_hashptr((void *)(ulong)(uint)k);
  iVar3 = 0;
  if ((k & 0xfffffffdU) != 1) {
    uVar4 = a->mask & uVar2;
    uVar5 = (ulong)uVar4;
    iVar1 = a->table[uVar4].k;
    if (iVar1 != 1) {
      if (iVar1 != k) {
        do {
          uVar5 = (ulong)((int)uVar5 + ((uVar2 >> 0x13) + (uVar2 >> 6) + uVar2 | 1) & a->mask);
          iVar3 = a->table[uVar5].k;
          if (iVar3 == 1) {
            return 0;
          }
        } while (iVar3 != k);
      }
      *kout = k;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}